

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

bool __thiscall Catch::TestSpecParser::separate(TestSpecParser *this)

{
  size_t sVar1;
  TestSpecParser *in_RDI;
  TestSpecParser *in_stack_00000020;
  bool local_1;
  
  if ((in_RDI->m_mode == QuotedName) || (in_RDI->m_mode == Tag)) {
    in_RDI->m_mode = None;
    sVar1 = std::__cxx11::string::size();
    in_RDI->m_pos = sVar1;
    std::__cxx11::string::clear();
    std::__cxx11::string::clear();
    in_RDI->m_realPatternPos = 0;
    local_1 = false;
  }
  else {
    endMode(in_RDI);
    addFilter(in_stack_00000020);
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool TestSpecParser::separate() {
      if( (m_mode==QuotedName) || (m_mode==Tag) ){
         //invalid argument, signal failure to previous scope.
         m_mode = None;
         m_pos = m_arg.size();
         m_substring.clear();
         m_patternName.clear();
         m_realPatternPos = 0;
         return false;
      }
      endMode();
      addFilter();
      return true; //success
    }